

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqHelper.cpp
# Opt level: O0

VirtualIterator<Kernel::Term_*>
Kernel::EqHelper::getRewritableSubtermIterator<Kernel::NonVariableNonTypeIterator>
          (Literal *lit,Ordering *ord)

{
  bool bVar1;
  Result RVar2;
  TermList *pTVar3;
  Term *pTVar4;
  NonVariableNonTypeIterator *this;
  Term *in_RSI;
  IteratorCore<Kernel::Term_*> *in_RDI;
  NonVariableNonTypeIterator si;
  NonVariableNonTypeIterator si_1;
  TermList sel;
  IteratorCore<Kernel::Term_*> *in_stack_ffffffffffffff18;
  NonVariableNonTypeIterator *in_stack_ffffffffffffff20;
  VirtualIterator<Kernel::Term_*> *this_00;
  undefined8 in_stack_ffffffffffffff30;
  undefined1 includeSelf;
  NonVariableNonTypeIterator *in_stack_ffffffffffffff38;
  NonVariableNonTypeIterator *it;
  NonVariableNonTypeIterator *in_stack_ffffffffffffff40;
  IteratorCore<Kernel::Term_*> *it_00;
  VirtualIterator<Kernel::Term_*> local_70 [3];
  NonVariableNonTypeIterator local_58;
  TermList local_20 [2];
  Term *local_10;
  
  includeSelf = (undefined1)((ulong)in_stack_ffffffffffffff30 >> 0x38);
  it_00 = in_RDI;
  local_10 = in_RSI;
  bVar1 = Literal::isEquality((Literal *)0x84d369);
  if (bVar1) {
    TermList::TermList(local_20);
    RVar2 = Ordering::getEqualityArgumentOrder
                      ((Ordering *)it_00,(Literal *)in_stack_ffffffffffffff40);
    this = (NonVariableNonTypeIterator *)(ulong)(RVar2 - GREATER);
    switch(this) {
    case (NonVariableNonTypeIterator *)0x0:
    case (NonVariableNonTypeIterator *)0x2:
      pTVar3 = Term::nthArgument(local_10,0);
      local_20[0]._content = pTVar3->_content;
      break;
    case (NonVariableNonTypeIterator *)0x1:
      pTVar3 = Term::nthArgument(local_10,1);
      local_20[0]._content = pTVar3->_content;
      break;
    case (NonVariableNonTypeIterator *)0x3:
      it = &local_58;
      NonVariableNonTypeIterator::NonVariableNonTypeIterator(this,(Term *)it,(bool)includeSelf);
      Lib::getUniquePersistentIteratorFromPtr<Kernel::NonVariableNonTypeIterator>(it);
      NonVariableNonTypeIterator::~NonVariableNonTypeIterator(in_stack_ffffffffffffff20);
      return (VirtualIterator<Kernel::Term_*>)in_RDI;
    }
    bVar1 = TermList::isTerm((TermList *)0x84d466);
    if (bVar1) {
      ::operator_new(0x38);
      pTVar4 = TermList::term((TermList *)0x84d495);
      NonVariableNonTypeIterator::NonVariableNonTypeIterator
                (this,(Term *)in_stack_ffffffffffffff38,SUB81((ulong)pTVar4 >> 0x38,0));
      this_00 = local_70;
      Lib::vi<Kernel::Term*>(in_stack_ffffffffffffff18);
      Lib::getUniquePersistentIterator<Lib::VirtualIterator<Kernel::Term*>>
                ((VirtualIterator<Kernel::Term_*> *)it_00);
      Lib::VirtualIterator<Kernel::Term_*>::~VirtualIterator(this_00);
    }
    else {
      Lib::VirtualIterator<Kernel::Term_*>::getEmpty();
    }
  }
  else {
    NonVariableNonTypeIterator::NonVariableNonTypeIterator
              (in_stack_ffffffffffffff40,(Term *)in_stack_ffffffffffffff38,(bool)includeSelf);
    Lib::getUniquePersistentIteratorFromPtr<Kernel::NonVariableNonTypeIterator>
              (in_stack_ffffffffffffff38);
    NonVariableNonTypeIterator::~NonVariableNonTypeIterator(in_stack_ffffffffffffff20);
  }
  return (VirtualIterator<Kernel::Term_*>)in_RDI;
}

Assistant:

VirtualIterator<ELEMENT_TYPE(SubtermIterator)> EqHelper::getRewritableSubtermIterator(Literal* lit, const Ordering& ord)
{
  if (lit->isEquality()) {
    TermList sel;
    switch(ord.getEqualityArgumentOrder(lit)) {
    case Ordering::INCOMPARABLE: {
      SubtermIterator si(lit);
      return getUniquePersistentIteratorFromPtr(&si);
    }
    case Ordering::EQUAL:
    case Ordering::GREATER:
      sel=*lit->nthArgument(0);
      break;
    case Ordering::LESS:
      sel=*lit->nthArgument(1);
      break;
#if VDEBUG
    default:
      ASSERTION_VIOLATION;
#endif
    }
    if (!sel.isTerm()) {
      return VirtualIterator<ELEMENT_TYPE(SubtermIterator)>::getEmpty();
    }
    return getUniquePersistentIterator(vi(new SubtermIterator(sel.term(), true)));
  }

  SubtermIterator si(lit);
  return getUniquePersistentIteratorFromPtr(&si);

}